

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_NtkNewStrId(Cba_Ntk_t *pNtk,char *format,...)

{
  char in_AL;
  int iVar1;
  Abc_Nam_t *p_00;
  Vec_Str_t *p_01;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list args;
  int nSize;
  int nAdded;
  Vec_Str_t *vBuf;
  Abc_Nam_t *p;
  char *format_local;
  Cba_Ntk_t *pNtk_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  p_00 = Cba_NtkNam(pNtk);
  p_01 = Abc_NamBuffer(p_00);
  args[0].reg_save_area._0_4_ = 1000;
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x10;
  iVar1 = Vec_StrSize(p_01);
  Vec_StrGrow(p_01,iVar1 + (int)args[0].reg_save_area);
  pcVar2 = Vec_StrLimit(p_01);
  args[0].reg_save_area._4_4_ = vsnprintf(pcVar2,(long)(int)args[0].reg_save_area,format,&local_48);
  if ((int)args[0].reg_save_area < args[0].reg_save_area._4_4_) {
    iVar1 = Vec_StrSize(p_01);
    Vec_StrGrow(p_01,iVar1 + args[0].reg_save_area._4_4_ + (int)args[0].reg_save_area);
    pcVar2 = Vec_StrLimit(p_01);
    args[0].reg_save_area._0_4_ =
         vsnprintf(pcVar2,(long)args[0].reg_save_area._4_4_,format,&local_48);
    if ((int)args[0].reg_save_area != args[0].reg_save_area._4_4_) {
      __assert_fail("nSize == nAdded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0x1e0,"int Cba_NtkNewStrId(Cba_Ntk_t *, const char *, ...)");
    }
  }
  pcVar2 = Vec_StrLimit(p_01);
  pcVar3 = Vec_StrLimit(p_01);
  iVar1 = Abc_NamStrFindOrAddLim(p_00,pcVar2,pcVar3 + args[0].reg_save_area._4_4_,(int *)0x0);
  return iVar1;
}

Assistant:

static inline int Cba_NtkNewStrId( Cba_Ntk_t * pNtk, const char * format, ...  )
{
    Abc_Nam_t * p = Cba_NtkNam( pNtk );
    Vec_Str_t * vBuf = Abc_NamBuffer( p );
    int nAdded, nSize = 1000; 
    va_list args;   va_start( args, format );
    Vec_StrGrow( vBuf, Vec_StrSize(vBuf) + nSize );
    nAdded = vsnprintf( Vec_StrLimit(vBuf), nSize, format, args );
    if ( nAdded > nSize )
    {
        Vec_StrGrow( vBuf, Vec_StrSize(vBuf) + nAdded + nSize );
        nSize = vsnprintf( Vec_StrLimit(vBuf), nAdded, format, args );
        assert( nSize == nAdded );
    }
    va_end( args );
    return Abc_NamStrFindOrAddLim( p, Vec_StrLimit(vBuf), Vec_StrLimit(vBuf) + nAdded, NULL );
}